

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::CollectedFuncInfo,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
(anonymous_namespace)::CollectedFuncInfo&)>)::Mapper::doWalkFunction(wasm::Function__
          (void *this,Function *curr)

{
  CollectedFuncInfo *this_00;
  _Rb_tree_color *this_01;
  _Base_ptr p_Var1;
  _Rb_tree_color *p_Var2;
  _Base_ptr *pp_Var3;
  _Base_ptr p_Var4;
  iterator __position;
  _Link_type __z;
  iterator __x;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  Function *local_48;
  Function *curr_local;
  __aligned_membuf<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>
  *local_38;
  
  this_01 = *(_Rb_tree_color **)((long)this + 0x138);
  pp_Var3 = (_Base_ptr *)(this_01 + 2);
  p_Var4 = (_Base_ptr)pp_Var3;
  p_Var2 = this_01;
  while (p_Var1 = *(_Base_ptr *)(p_Var2 + 4), p_Var1 != (_Base_ptr)0x0) {
    if (*(Function **)(p_Var1 + 1) >= curr) {
      p_Var4 = p_Var1;
    }
    p_Var2 = &p_Var1->_M_color + (ulong)(*(Function **)(p_Var1 + 1) < curr) * 2;
  }
  local_48 = curr;
  if ((p_Var4 != (_Base_ptr)pp_Var3) && (*(Function **)(p_Var4 + 1) <= curr)) {
    curr_local = (Function *)this;
    __position = std::
                 map<wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                 ::lower_bound((map<wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                                *)this_01,&local_48);
    if ((__position._M_node == (_Base_ptr)pp_Var3) ||
       (__x = __position, curr < *(Function **)(__position._M_node + 1))) {
      __z = (_Link_type)operator_new(200);
      local_38 = &__z->_M_storage;
      *(Function **)(__z->_M_storage)._M_storage = curr;
      this_00 = (CollectedFuncInfo *)((__z->_M_storage)._M_storage + 8);
      memset(this_00,0,0xa0);
      anon_unknown_183::CollectedFuncInfo::CollectedFuncInfo(this_00);
      pVar5 = std::
              _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
              ::_M_get_insert_hint_unique_pos
                        ((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                          *)this_01,(const_iterator)__position._M_node,(key_type *)local_38);
      __x._M_node = pVar5.first;
      if (pVar5.second == (_Base_ptr)0x0) {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
        ::_M_drop_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                        *)__z,(_Link_type)__position._M_node);
      }
      else {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
        ::_M_insert_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                          *)this_01,__x._M_node,pVar5.second,__z);
        __x._M_node = (_Base_ptr)__z;
      }
    }
    std::function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo_&)>::
    operator()((function<void_(wasm::Function_*,_wasm::(anonymous_namespace)::CollectedFuncInfo_&)>
                *)&curr_local->expressionLocations,curr,
               (CollectedFuncInfo *)((((_Link_type)__x._M_node)->_M_storage)._M_storage + 8));
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous namespace)::CollectedFuncInfo>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = wasm::(anonymous namespace)::CollectedFuncInfo, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }